

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator __thiscall
fmt::v6::internal::
arg_formatter_base<fmt::v6::buffer_range<wchar_t>,_fmt::v6::internal::error_handler>::operator()
          (arg_formatter_base<fmt::v6::buffer_range<wchar_t>,_fmt::v6::internal::error_handler>
           *this,basic_string_view<wchar_t> value)

{
  basic_string_view<wchar_t> s;
  iterator iVar1;
  size_t in_RCX;
  basic_writer<fmt::v6::buffer_range<wchar_t>_> *in_RDX;
  format_specs *in_RSI;
  basic_writer<fmt::v6::buffer_range<wchar_t>_> *in_RDI;
  arg_formatter_base<fmt::v6::buffer_range<wchar_t>,_fmt::v6::internal::error_handler>
  *in_stack_ffffffffffffffa8;
  wchar_t *in_stack_ffffffffffffffd8;
  
  if (in_RDI[1].out_.container == (buffer<wchar_t> *)0x0) {
    basic_writer<fmt::v6::buffer_range<wchar_t>_>::write(in_RDI,(int)in_RSI,in_RDX,in_RCX);
  }
  else {
    check_string_type_spec<char,fmt::v6::internal::error_handler>
              ((char)((ulong)in_RDI >> 0x38),(error_handler *)in_stack_ffffffffffffffa8);
    s.size_ = (size_t)in_RDI;
    s.data_ = in_stack_ffffffffffffffd8;
    basic_writer<fmt::v6::buffer_range<wchar_t>_>::write<wchar_t>(in_RDX,s,in_RSI);
  }
  iVar1 = out(in_stack_ffffffffffffffa8);
  return (iterator)iVar1.container;
}

Assistant:

iterator operator()(basic_string_view<char_type> value) {
    if (specs_) {
      internal::check_string_type_spec(specs_->type, internal::error_handler());
      writer_.write(value, *specs_);
    } else {
      writer_.write(value);
    }
    return out();
  }